

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O0

void __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
AMHAStar(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
        EnvironmentPtr *env_ptr,double time_limit,double epsilon,double mha_epsilon,
        double del_epsilon,double del_mha_epsilon,int num_inad)

{
  int num_inad_local;
  double del_mha_epsilon_local;
  double del_epsilon_local;
  double mha_epsilon_local;
  double epsilon_local;
  double time_limit_local;
  EnvironmentPtr *env_ptr_local;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this_local;
  
  Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::Dijkstra
            (&this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ,env_ptr,time_limit);
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  _vptr_Dijkstra = (_func_int **)&PTR_run_0012ac88;
  std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::vector
            (&this->open_inad_);
  std::
  unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
  ::unordered_map(&this->closed_inad_);
  std::
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ::vector(&this->incons_);
  std::
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ::vector(&this->incons_inad_);
  AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState>::AnytimePlannerStats
            (&this->anytime_stats_);
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.eps_ = epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.mha_eps_ = mha_epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.delta_eps_ = del_epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.delta_mha_eps_ = del_mha_epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.num_inad_ = num_inad;
  std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::reserve
            (&this->open_inad_,(long)num_inad);
  return;
}

Assistant:

AMHAStar(EnvironmentPtr& env_ptr,
             double time_limit,
             double epsilon,
             double mha_epsilon,
             double del_epsilon,
             double del_mha_epsilon,
             int num_inad) : Dijkstra<Environment,
      State,
      HeapValueType>(env_ptr,
                     time_limit)
    {
      this->params_.eps_ = epsilon;
      this->params_.mha_eps_ = mha_epsilon;
      
      this->params_.delta_eps_ = del_epsilon;
      this->params_.delta_mha_eps_ = del_mha_epsilon;
      
      this->params_.num_inad_ = num_inad;
      
      open_inad_.reserve(num_inad);
    }